

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_key_value_api_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_75a36::BaseKeyValAPI::SetUp(BaseKeyValAPI *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  aom_codec_dec_cfg_t dec_cfg;
  aom_codec_iface_t *iface_dx;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int usage;
  aom_codec_enc_cfg_t enc_cfg;
  aom_codec_iface_t *iface_cx;
  AssertHelper *in_stack_fffffffffffffb70;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb78;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  undefined4 uVar2;
  aom_codec_iface_t *in_stack_fffffffffffffb88;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb90;
  aom_codec_ctx_t *ctx;
  undefined4 in_stack_fffffffffffffb98;
  Type in_stack_fffffffffffffb9c;
  Type type;
  aom_codec_ctx_t *in_stack_fffffffffffffba0;
  AssertionResult local_428;
  Message *in_stack_fffffffffffffbe8;
  Message *message;
  AssertHelper *in_stack_fffffffffffffbf0;
  AssertHelper *this_02;
  aom_codec_ctx_t local_3e8;
  AssertionResult local_3b0;
  undefined4 local_39c;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_39c = 0;
  local_3e8.priv._4_4_ = 0;
  local_3e8.priv._0_4_ =
       aom_codec_enc_config_default
                 ((aom_codec_iface_t *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                  ,in_stack_fffffffffffffb78,(uint)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffb88,
             (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             &in_stack_fffffffffffffb78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffba0 =
         (aom_codec_ctx_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3b82c1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x3b831e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8376);
  aom_codec_enc_init_ver
            (in_stack_fffffffffffffba0,
             (aom_codec_iface_t *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             in_stack_fffffffffffffb90,(aom_codec_flags_t)in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb84);
  ctx = &local_3e8;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffb88,
             (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             &in_stack_fffffffffffffb78->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)ctx);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb9c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffb88 =
         (aom_codec_iface_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3b8446)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,type,(char *)ctx,
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x3b84a3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b84fb);
  aom_codec_av1_dx();
  message = (Message *)0x0;
  this_02 = (AssertHelper *)0x100000000;
  aom_codec_dec_init_ver
            (ctx,in_stack_fffffffffffffb88,
             (aom_codec_dec_cfg_t *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (aom_codec_flags_t)in_stack_fffffffffffffb78,
             (int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  this_01 = &local_428;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffb88,
             (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (aom_codec_err_t *)this_01,(aom_codec_err_t *)in_stack_fffffffffffffb70);
  line = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb84);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3b85d2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,type,(char *)ctx,line,
               (char *)CONCAT44(uVar2,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(this_02,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x3b8620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b866c);
  return;
}

Assistant:

void SetUp() override {
#if CONFIG_AV1_ENCODER
    aom_codec_iface_t *iface_cx = aom_codec_av1_cx();
    aom_codec_enc_cfg_t enc_cfg;
#if CONFIG_REALTIME_ONLY
    const int usage = 1;
#else
    const int usage = 0;
#endif
    EXPECT_EQ(AOM_CODEC_OK,
              aom_codec_enc_config_default(iface_cx, &enc_cfg, usage));
    EXPECT_EQ(AOM_CODEC_OK,
              aom_codec_enc_init(&enc_, iface_cx, &enc_cfg, usage));
#endif
#if CONFIG_AV1_DECODER
    aom_codec_iface_t *iface_dx = aom_codec_av1_dx();
    aom_codec_dec_cfg_t dec_cfg = { 0, 0, 0, !FORCE_HIGHBITDEPTH_DECODING };

    EXPECT_EQ(AOM_CODEC_OK, aom_codec_dec_init(&dec_, iface_dx, &dec_cfg, 0));
#endif
  }